

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void prune_tx_split_no_split
               (MACROBLOCK *x,BLOCK_SIZE bsize,int blk_row,int blk_col,TX_SIZE tx_size,
               int *try_no_split,int *try_split,int pruning_level)

{
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  float *in_RDI;
  byte in_R8B;
  undefined4 *in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  int split_thresh_scale;
  int split_thresh_scales [4];
  int no_split_thresh_scale;
  int no_split_thresh_scales [4];
  int ac_q;
  int dc_q;
  float var_of_vars;
  float dev_of_means;
  int bh;
  int bw;
  int16_t *diff;
  int diff_stride;
  int local_78 [7];
  int local_5c;
  int local_58 [5];
  int local_44;
  float local_40;
  float local_3c;
  int local_38;
  int local_34;
  long local_30;
  uint local_24;
  undefined4 *local_20;
  undefined3 in_stack_fffffffffffffff4;
  
  local_24 = (uint)block_size_wide[in_SIL];
  local_30 = *(long *)in_RDI + (long)(int)(in_EDX * 4 * local_24) * 2 + (long)(in_ECX << 2) * 2;
  local_34 = tx_size_wide[in_R8B];
  local_38 = tx_size_high[in_R8B];
  local_3c = 0.0;
  local_40 = 0.0;
  local_20 = in_R9;
  get_blk_var_dev((int16_t *)CONCAT44(split_thresh_scales[1],split_thresh_scales[0]),
                  split_thresh_scale,in_stack_00000008,unaff_retaddr,in_RDI,
                  (float *)CONCAT44(CONCAT13(in_SIL,in_stack_fffffffffffffff4),in_EDX));
  local_44 = (int)**(short **)(in_RDI + 0x20) >> 3;
  local_58[4] = (int)*(short *)(*(long *)(in_RDI + 0x20) + 2) >> 3;
  local_58[0] = 0;
  local_58[1] = 0x18;
  local_58[2] = 8;
  local_58[3] = 8;
  local_5c = local_58[split_thresh_scales[0]];
  local_78[0] = 0;
  local_78[1] = 0x18;
  local_78[2] = 10;
  local_78[3] = 8;
  if ((local_3c <= (float)local_44) &&
     ((float)local_78[split_thresh_scales[0]] * local_40 <= (float)(local_58[4] * local_58[4]))) {
    *(undefined4 *)CONCAT44(split_thresh_scale,in_stack_00000008) = 0;
  }
  if (((float)(local_5c * local_44) < local_3c) &&
     ((float)(local_5c * local_58[4] * local_58[4]) < local_40)) {
    *local_20 = 0;
  }
  return;
}

Assistant:

static void prune_tx_split_no_split(MACROBLOCK *x, BLOCK_SIZE bsize,
                                    int blk_row, int blk_col, TX_SIZE tx_size,
                                    int *try_no_split, int *try_split,
                                    int pruning_level) {
  const int diff_stride = block_size_wide[bsize];
  const int16_t *diff =
      x->plane[0].src_diff + 4 * blk_row * diff_stride + 4 * blk_col;
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  float dev_of_means = 0.0f;
  float var_of_vars = 0.0f;

  // This function calculates the deviation of means, and the variance of pixel
  // variances of the block as well as it's sub-blocks.
  get_blk_var_dev(diff, diff_stride, bw, bh, &dev_of_means, &var_of_vars);
  const int dc_q = x->plane[0].dequant_QTX[0] >> 3;
  const int ac_q = x->plane[0].dequant_QTX[1] >> 3;
  const int no_split_thresh_scales[4] = { 0, 24, 8, 8 };
  const int no_split_thresh_scale = no_split_thresh_scales[pruning_level];
  const int split_thresh_scales[4] = { 0, 24, 10, 8 };
  const int split_thresh_scale = split_thresh_scales[pruning_level];

  if ((dev_of_means <= dc_q) &&
      (split_thresh_scale * var_of_vars <= ac_q * ac_q)) {
    *try_split = 0;
  }
  if ((dev_of_means > no_split_thresh_scale * dc_q) &&
      (var_of_vars > no_split_thresh_scale * ac_q * ac_q)) {
    *try_no_split = 0;
  }
}